

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  pointer pcVar1;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_40 = (undefined1  [8])&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + message->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"\n");
  (*this->_vptr_AbstractSocketWriter[2])(this,local_40);
  if (local_40 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_40,__str._M_string_length + 1);
  }
  return;
}

Assistant:

void SendLn(const string& message) {
      Send(message + "\n");
    }